

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_ping_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->hd).stream_id == 0) {
    if (((((session->opt_flags & 8) != 0) || (((frame->hd).flags & 1) != 0)) ||
        (iVar1 = session_is_closing(session), iVar1 != 0)) ||
       (session_local._4_4_ = nghttp2_session_add_ping(session,'\x01',(frame->ping).opaque_data),
       session_local._4_4_ == 0)) {
      session_local._4_4_ = session_call_on_frame_received(session,frame);
    }
  }
  else {
    session_local._4_4_ =
         session_handle_invalid_connection(session,frame,-0x1f9,"PING: stream_id != 0");
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_ping_received(nghttp2_session *session,
                                     nghttp2_frame *frame) {
  int rv = 0;
  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "PING: stream_id != 0");
  }
  if ((session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_PING_ACK) == 0 &&
      (frame->hd.flags & NGHTTP2_FLAG_ACK) == 0 &&
      !session_is_closing(session)) {
    /* Peer sent ping, so ping it back */
    rv = nghttp2_session_add_ping(session, NGHTTP2_FLAG_ACK,
                                  frame->ping.opaque_data);
    if (rv != 0) {
      return rv;
    }
  }
  return session_call_on_frame_received(session, frame);
}